

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_invert_variance_full(gauden_t *g)

{
  int32 iVar1;
  uint local_1c;
  uint local_18;
  uint32 k;
  uint32 j;
  uint32 i;
  gauden_t *g_local;
  
  k = 0;
  do {
    if (g->n_mgau <= k) {
      return 0;
    }
    for (local_18 = 0; local_18 < g->n_feat; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < g->n_density; local_1c = local_1c + 1) {
        iVar1 = invert((float32 **)g->fullvar[k][local_18][local_1c],
                       (float32 **)g->fullvar[k][local_18][local_1c],g->veclen[local_18]);
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,499,"Singular covariance matrix ([%d][%d][%d]), can\'t continue!\n",(ulong)k,
                  (ulong)local_18,local_1c);
          exit(1);
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int
gauden_invert_variance_full(gauden_t *g)
{
    uint32 i, j, k;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		/* Yes, this works in-place (we hope) */
		if (invert(g->fullvar[i][j][k], g->fullvar[i][j][k],
			   g->veclen[j]) != S3_SUCCESS) {
		    /* Shouldn't get here, due to the check in full_norm() */
		    E_FATAL("Singular covariance matrix ([%d][%d][%d]), can't continue!\n",
			    i, j, k);
		}
	    }
	}
    }

    return S3_SUCCESS;
}